

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O3

void __thiscall
Sequence::make_itemset(Sequence *this,Itemset_S *it,Array_S *ary,int cnt,vint *clscnt)

{
  element_type *peVar1;
  int iVar2;
  element_type *peVar3;
  long lVar4;
  ulong uVar5;
  
  peVar3 = (ary->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (0 < peVar3->theSize) {
    uVar5 = 0;
    do {
      peVar1 = (peVar3->theArray).
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar4 = *(long *)&(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl;
      if ((ulong)((long)*(pointer *)
                         ((long)&(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8
                         ) - lVar4 >> 2) <= uVar5) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5
                  );
      }
      Array::add((((it->super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->theIval).
                 super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 *(int *)(lVar4 + uVar5 * 4));
      uVar5 = uVar5 + 1;
      peVar3 = (ary->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    } while ((long)uVar5 < (long)peVar3->theSize);
  }
  ((it->super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->theSupport = cnt;
  iVar2 = ClassInfo::get_num_class
                    ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      (((it->super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->clsSup).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[lVar4]
           = (clscnt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start[lVar4];
      lVar4 = lVar4 + 1;
      iVar2 = ClassInfo::get_num_class
                        ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    } while (lVar4 < iVar2);
  }
  return;
}

Assistant:

void Sequence::make_itemset(Itemset_S& it, Array_S& ary, int cnt, const vint &clscnt) {
    int i;
    for (i = 0; i < ary->size(); i++) {
        it->ival()->optadd((*ary)[i]);
    }
    it->set_support(cnt);
    for (i = 0; i < cls->get_num_class(); i++) it->set_cls_support(clscnt[i], i);
}